

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_feature_if_needed(Mesh *this,Selection *s)

{
  Vertex *v_00;
  Halfedge *h_00;
  Halfedge *h;
  Vertex *v;
  Selection *s_local;
  Mesh *this_local;
  
  if (s->element != (HalfedgeElement *)0x0) {
    glDisable(0xb71);
    v_00 = HalfedgeElement::getVertex(s->element);
    if (v_00 != (Vertex *)0x0) {
      draw_vertex(this,v_00);
    }
    h_00 = HalfedgeElement::getHalfedge(s->element);
    if (h_00 != (Halfedge *)0x0) {
      draw_halfedge_arrow(this,h_00);
    }
    glEnable(0xb71);
  }
  return;
}

Assistant:

void Mesh::draw_feature_if_needed( Selection *s ) const
{

  if( s->element == NULL ) return;

  glDisable(GL_DEPTH_TEST);

  const Vertex *v = s->element->getVertex();
  if (v != nullptr) {
    draw_vertex( v );
  }
  const Halfedge *h = s->element->getHalfedge();
  if (h != nullptr) {
    draw_halfedge_arrow( h );
  }

  glEnable(GL_DEPTH_TEST);
}